

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_PersonHandle.cpp
# Opt level: O2

int __thiscall mbc::Val::PersonHandle::init(PersonHandle *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  istream *piVar2;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  size_type *local_128;
  string name;
  string sex;
  string telephone;
  string location;
  string mail_number;
  string email;
  string qq_number;
  string classes;
  Input input;
  
  units::Input::Input((Input *)((long)&classes.field_2 + 8),(istream *)&std::cin,
                      (ostream *)&std::cout);
  local_128 = &name._M_string_length;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length._0_1_ = 0;
  name.field_2._8_8_ = &sex._M_string_length;
  sex._M_dataplus._M_p = (pointer)0x0;
  sex.field_2._8_8_ = &telephone._M_string_length;
  telephone._M_dataplus._M_p = (pointer)0x0;
  sex._M_string_length._0_1_ = 0;
  telephone._M_string_length._0_1_ = 0;
  telephone.field_2._8_8_ = &location._M_string_length;
  location._M_dataplus._M_p = (pointer)0x0;
  location.field_2._8_8_ = &mail_number._M_string_length;
  mail_number._M_dataplus._M_p = (pointer)0x0;
  location._M_string_length._0_1_ = 0;
  mail_number._M_string_length._0_1_ = 0;
  mail_number.field_2._8_8_ = &email._M_string_length;
  email._M_dataplus._M_p = (pointer)0x0;
  email.field_2._8_8_ = &qq_number._M_string_length;
  qq_number._M_dataplus._M_p = (pointer)0x0;
  email._M_string_length._0_1_ = 0;
  qq_number._M_string_length._0_1_ = 0;
  qq_number.field_2._8_8_ = &classes._M_string_length;
  classes._M_dataplus._M_p = (pointer)0x0;
  classes._M_string_length._0_1_ = 0;
  std::__cxx11::string::string
            ((string *)&local_448," | please enter name",(allocator *)((long)&input.out_ + 7));
  piVar2 = units::Input::operator()((Input *)((long)&classes.field_2 + 8),&local_448);
  std::operator>>(piVar2,(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::string
            ((string *)&local_428," | please enter sex [M/F]",(allocator *)((long)&input.out_ + 7));
  piVar2 = units::Input::operator()((Input *)((long)&classes.field_2 + 8),&local_428);
  std::operator>>(piVar2,(string *)(name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::string
            ((string *)&local_408," | please enter telephone [only include digit]",
             (allocator *)((long)&input.out_ + 7));
  piVar2 = units::Input::operator()((Input *)((long)&classes.field_2 + 8),&local_408);
  std::operator>>(piVar2,(string *)(sex.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::string
            ((string *)&local_3e8," | please enter location",(allocator *)((long)&input.out_ + 7));
  piVar2 = units::Input::operator()((Input *)((long)&classes.field_2 + 8),&local_3e8);
  std::operator>>(piVar2,(string *)(telephone.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::string
            ((string *)&local_3c8," | please enter postal number [6-length number]",
             (allocator *)((long)&input.out_ + 7));
  piVar2 = units::Input::operator()((Input *)((long)&classes.field_2 + 8),&local_3c8);
  std::operator>>(piVar2,(string *)(location.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::string
            ((string *)&local_3a8," | please enter email",(allocator *)((long)&input.out_ + 7));
  piVar2 = units::Input::operator()((Input *)((long)&classes.field_2 + 8),&local_3a8);
  std::operator>>(piVar2,(string *)(mail_number.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::string
            ((string *)&local_388," | please enter qq number",(allocator *)((long)&input.out_ + 7));
  piVar2 = units::Input::operator()((Input *)((long)&classes.field_2 + 8),&local_388);
  std::operator>>(piVar2,(string *)(email.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::string
            ((string *)&local_368," | please enter classes",(allocator *)((long)&input.out_ + 7));
  units::Input::operator()((Input *)((long)&classes.field_2 + 8),&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::ws<char,std::char_traits<char>>((istream *)&std::cin);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)(qq_number.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_348," | ",(allocator *)((long)&input.out_ + 7));
  units::Input::operator()((Input *)((long)&classes.field_2 + 8),&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string((string *)&local_328,"name",(allocator *)((long)&input.out_ + 7));
  std::__cxx11::string::string((string *)&local_308,(string *)&local_128);
  changeAttr(this,&local_328,&local_308);
  std::__cxx11::string::string((string *)&local_2e8,"sex",(allocator *)&input.out_);
  std::__cxx11::string::string((string *)&local_2c8,(string *)(name.field_2._M_local_buf + 8));
  changeAttr(this,&local_2e8,&local_2c8);
  std::__cxx11::string::string
            ((string *)&local_2a8,"telephone",(allocator *)((long)&input.out_ + 1));
  std::__cxx11::string::string((string *)&local_288,(string *)(sex.field_2._M_local_buf + 8));
  changeAttr(this,&local_2a8,&local_288);
  std::__cxx11::string::string((string *)&local_268,"location",(allocator *)((long)&input.out_ + 2))
  ;
  std::__cxx11::string::string((string *)&local_248,(string *)(telephone.field_2._M_local_buf + 8));
  changeAttr(this,&local_268,&local_248);
  std::__cxx11::string::string
            ((string *)&local_228,"mail_number",(allocator *)((long)&input.out_ + 3));
  std::__cxx11::string::string((string *)&local_208,(string *)(location.field_2._M_local_buf + 8));
  changeAttr(this,&local_228,&local_208);
  std::__cxx11::string::string((string *)&local_1e8,"email",(allocator *)((long)&input.out_ + 4));
  std::__cxx11::string::string
            ((string *)&local_1c8,(string *)(mail_number.field_2._M_local_buf + 8));
  changeAttr(this,&local_1e8,&local_1c8);
  std::__cxx11::string::string
            ((string *)&local_1a8,"qq_number",(allocator *)((long)&input.out_ + 5));
  std::__cxx11::string::string((string *)&local_188,(string *)(email.field_2._M_local_buf + 8));
  changeAttr(this,&local_1a8,&local_188);
  std::__cxx11::string::string((string *)&local_168,"classes",(allocator *)((long)&input.out_ + 6));
  std::__cxx11::string::string((string *)&local_148,(string *)(qq_number.field_2._M_local_buf + 8));
  changeAttr(this,&local_168,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)(qq_number.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(email.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(mail_number.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(location.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(telephone.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sex.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  iVar1 = std::__cxx11::string::~string((string *)&local_128);
  return iVar1;
}

Assistant:

void PersonHandle::init() {
    units::Input input(std::cin, std::cout);
    string name, sex, telephone, location, mail_number, email, qq_number, classes;

    input(" | please enter name") >> name;
    input(" | please enter sex [M/F]") >> sex;;
    input(" | please enter telephone [only include digit]") >> telephone;
    input(" | please enter location") >> location;
    input(" | please enter postal number [6-length number]") >> mail_number;
    input(" | please enter email") >> email;
    input(" | please enter qq number") >> qq_number;
    input(" | please enter classes");
    std::cin >> std::ws;
    std::getline(std::cin, classes);
    input(" | ");

    (*this)
        .changeAttr("name", name)
        .changeAttr("sex",  sex)
        .changeAttr("telephone", telephone)
        .changeAttr("location", location)
        .changeAttr("mail_number", mail_number)
        .changeAttr("email", email)
        .changeAttr("qq_number", qq_number)
        .changeAttr("classes", classes)
    ;

    return;
}